

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O1

void features::Sift::load_lowe_descriptors(string *filename,Descriptors *result)

{
  pointer *ppDVar1;
  float *pfVar2;
  float fVar3;
  pointer pDVar4;
  iterator __position;
  istream *this;
  istream *piVar5;
  runtime_error *prVar6;
  long lVar7;
  int iVar8;
  float fVar9;
  undefined1 auStack_450 [8];
  Descriptor descriptor;
  ifstream in;
  int aiStack_220 [122];
  int local_38;
  int local_34;
  int num_dimensions;
  int num_descriptors;
  
  std::ifstream::ifstream(descriptor.data.v + 0x7e,(filename->_M_dataplus)._M_p,_S_in);
  if (*(int *)((long)aiStack_220 + *(long *)(descriptor.data.v._504_8_ + -0x18)) != 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Cannot open descriptor file");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this = (istream *)std::istream::operator>>((istream *)(descriptor.data.v + 0x7e),&local_34);
  std::istream::operator>>(this,&local_38);
  if (((long)local_34 < 0x186a1) && (local_38 == 0x80)) {
    pDVar4 = (result->
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((result->
        super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>)
        ._M_impl.super__Vector_impl_data._M_finish != pDVar4) {
      (result->
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>).
      _M_impl.super__Vector_impl_data._M_finish = pDVar4;
    }
    std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::reserve
              (result,(long)local_34);
    if (0 < local_34) {
      iVar8 = 0;
      pfVar2 = descriptor.data.v + 0x7e;
      do {
        piVar5 = std::istream::_M_extract<float>(pfVar2);
        piVar5 = std::istream::_M_extract<float>((float *)piVar5);
        piVar5 = std::istream::_M_extract<float>((float *)piVar5);
        std::istream::_M_extract<float>((float *)piVar5);
        lVar7 = 0x10;
        do {
          std::istream::_M_extract<float>(pfVar2);
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x210);
        fVar9 = 0.0;
        lVar7 = 0x10;
        do {
          fVar3 = *(float *)((long)descriptor.data.v + lVar7 + -0x18);
          fVar9 = fVar9 + fVar3 * fVar3;
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x210);
        if (fVar9 < 0.0) {
          fVar9 = sqrtf(fVar9);
        }
        else {
          fVar9 = SQRT(fVar9);
        }
        lVar7 = 0x10;
        do {
          *(float *)((long)descriptor.data.v + lVar7 + -0x18) =
               *(float *)((long)descriptor.data.v + lVar7 + -0x18) / fVar9;
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x210);
        __position._M_current =
             (result->
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (result->
            super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<features::Sift::Descriptor,std::allocator<features::Sift::Descriptor>>::
          _M_realloc_insert<features::Sift::Descriptor_const&>
                    ((vector<features::Sift::Descriptor,std::allocator<features::Sift::Descriptor>>
                      *)result,__position,(Descriptor *)auStack_450);
        }
        else {
          (__position._M_current)->x = (float)auStack_450._0_4_;
          (__position._M_current)->y = (float)auStack_450._4_4_;
          (__position._M_current)->scale = descriptor.x;
          (__position._M_current)->orientation = descriptor.y;
          memmove(&(__position._M_current)->data,&descriptor.scale,0x200);
          ppDVar1 = &(result->
                     super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < local_34);
    }
    if (*(int *)((long)aiStack_220 + *(long *)(descriptor.data.v._504_8_ + -0x18)) == 0) {
      std::ifstream::close();
      std::ifstream::~ifstream(descriptor.data.v + 0x7e);
      return;
    }
    pDVar4 = (result->
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((result->
        super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>)
        ._M_impl.super__Vector_impl_data._M_finish != pDVar4) {
      (result->
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>).
      _M_impl.super__Vector_impl_data._M_finish = pDVar4;
    }
    std::ifstream::close();
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Error while reading descriptors");
  }
  else {
    std::ifstream::close();
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Invalid number of descriptors/dimensions");
  }
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
Sift::load_lowe_descriptors (std::string const& filename, Descriptors* result)
{
    std::ifstream in(filename.c_str());
    if (!in.good())
        throw std::runtime_error("Cannot open descriptor file");

    int num_descriptors;
    int num_dimensions;
    in >> num_descriptors >> num_dimensions;
    if (num_descriptors > 100000 || num_dimensions != 128)
    {
        in.close();
        throw std::runtime_error("Invalid number of descriptors/dimensions");
    }
    result->clear();
    result->reserve(num_descriptors);
    for (int i = 0; i < num_descriptors; ++i)
    {
        Sift::Descriptor descriptor;
        in >> descriptor.y >> descriptor.x
            >> descriptor.scale >> descriptor.orientation;
        for (int j = 0; j < 128; ++j)
            in >> descriptor.data[j];
        descriptor.data.normalize();
        result->push_back(descriptor);
    }

    if (!in.good())
    {
        result->clear();
        in.close();
        throw std::runtime_error("Error while reading descriptors");
    }

    in.close();
}